

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_bind_null(sqlite3_stmt *pStmt,int i)

{
  int iVar1;
  Vdbe *p;
  int rc;
  
  iVar1 = vdbeUnbind((Vdbe *)CONCAT44(i,rc),p._4_4_);
  if (iVar1 == 0) {
    sqlite3_mutex_leave((sqlite3_mutex *)0x14122d);
  }
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_bind_null(sqlite3_stmt *pStmt, int i){
  int rc;
  Vdbe *p = (Vdbe*)pStmt;
  rc = vdbeUnbind(p, (u32)(i-1));
  if( rc==SQLITE_OK ){
    assert( p!=0 && p->aVar!=0 && i>0 && i<=p->nVar ); /* tag-20240917-01 */
    sqlite3_mutex_leave(p->db->mutex);
  }
  return rc;
}